

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

string * __thiscall
duckdb::TemporaryFileManager::CreateTemporaryFileName_abi_cxx11_
          (string *__return_storage_ptr__,TemporaryFileManager *this,
          TemporaryFileIdentifier *identifier)

{
  FileSystem *this_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  unsigned_long in_R8;
  allocator local_89;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  this_00 = FileSystem::GetFileSystem(this->db);
  local_88[0] = local_78;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"duckdb_temp_storage_%s-%llu.tmp","");
  pcVar1 = EnumUtil::ToChars<duckdb::TemporaryBufferSize>(identifier->size);
  ::std::__cxx11::string::string((string *)&local_68,pcVar1,&local_89);
  params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           optional_idx::GetIndex(&identifier->file_index);
  StringUtil::Format<std::__cxx11::string,unsigned_long>
            (&local_48,(StringUtil *)local_88,&local_68,params,in_R8);
  FileSystem::JoinPath
            ((string *)__return_storage_ptr__,this_00,(string *)&this->temp_directory,
             (string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string TemporaryFileManager::CreateTemporaryFileName(const TemporaryFileIdentifier &identifier) const {
	return FileSystem::GetFileSystem(db).JoinPath(
	    temp_directory, StringUtil::Format("duckdb_temp_storage_%s-%llu.tmp", EnumUtil::ToString(identifier.size),
	                                       identifier.file_index.GetIndex()));
}